

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintCharAndCodeTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  undefined7 in_register_00000039;
  ulong uVar5;
  long lVar6;
  char local_41;
  uchar local_40;
  undefined7 uStack_3f;
  long local_38;
  
  uVar5 = CONCAT71(in_register_00000039,c);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar3 = (int)uVar5;
  switch(uVar5 & 0xffffffff) {
  case 0:
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    return;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
switchD_0016c960_caseD_1:
    if (iVar3 - 0x20U < 0x5f) {
      local_40 = c;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
      iVar3 = 0;
    }
    else {
      String::Format((char *)&local_40,"\\x%X",uVar5 & 0xffffffff);
      pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
      if (pvVar1 == (void *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"(null)",6);
      }
      else {
        if (local_38 != 0) {
          lVar6 = 0;
          do {
            if (*(char *)((long)pvVar1 + lVar6) == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
            }
            else {
              local_41 = *(char *)((long)pvVar1 + lVar6);
              std::__ostream_insert<char,std::char_traits<char>>(os,&local_41,1);
            }
            lVar6 = lVar6 + 1;
          } while (local_38 != lVar6);
        }
        operator_delete__(pvVar1);
      }
      iVar3 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    if (c == '\0') {
      return;
    }
    goto LAB_0016ca43;
  case 7:
    pcVar4 = "\\a";
    break;
  case 8:
    pcVar4 = "\\b";
    break;
  case 9:
    pcVar4 = "\\t";
    break;
  case 10:
    pcVar4 = "\\n";
    break;
  case 0xb:
    pcVar4 = "\\v";
    break;
  case 0xc:
    pcVar4 = "\\f";
    break;
  case 0xd:
    pcVar4 = "\\r";
    break;
  default:
    if (iVar3 == 0x27) {
      pcVar4 = "\\\'";
    }
    else {
      if (iVar3 != 0x5c) goto switchD_0016c960_caseD_1;
      pcVar4 = "\\\\";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
  iVar3 = 2;
LAB_0016ca43:
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  String::Format((char *)&local_40,"%d",uVar5 & 0xffffffff);
  pcVar4 = (char *)CONCAT71(uStack_3f,local_40);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar2);
    operator_delete__(pcVar4);
  }
  if (9 < c && iVar3 != 1) {
    String::Format((char *)&local_40,", 0x%X",uVar5 & 0xffffffff);
    pcVar4 = (char *)CONCAT71(uStack_3f,local_40);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar2 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar2);
      operator_delete__(pcVar4);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}